

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cc
# Opt level: O0

int32 __thiscall re2::ACMRandom::Next(ACMRandom *this)

{
  uint uVar1;
  uint local_1c;
  uint32 hi;
  uint32 lo;
  int32 A;
  int32 M;
  ACMRandom *this_local;
  
  uVar1 = ((uint)this->seed_ >> 0x10) * 0x41a7;
  local_1c = (uVar1 & 0x7fff) * 0x10000 + (this->seed_ & 0xffffU) * 0x41a7;
  if (0x7fffffff < local_1c) {
    local_1c = (local_1c & 0x7fffffff) + 1;
  }
  local_1c = (uVar1 >> 0xf) + local_1c;
  if (0x7fffffff < local_1c) {
    local_1c = (local_1c & 0x7fffffff) + 1;
  }
  this->seed_ = local_1c;
  return local_1c;
}

Assistant:

int32 ACMRandom::Next() {
  const int32 M = 2147483647L;   // 2^31-1
  const int32 A = 16807;
  // In effect, we are computing seed_ = (seed_ * A) % M, where M = 2^31-1
  uint32 lo = A * (int32)(seed_ & 0xFFFF);
  uint32 hi = A * (int32)((uint32)seed_ >> 16);
  lo += (hi & 0x7FFF) << 16;
  if (lo > M) {
    lo &= M;
    ++lo;
  }
  lo += hi >> 15;
  if (lo > M) {
    lo &= M;
    ++lo;
  }
  return (seed_ = (int32) lo);
}